

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O3

int32_t __thiscall CVmObjStringBuffer::utf8_length(CVmObjStringBuffer *this)

{
  int *piVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  iVar2 = *piVar1;
  if (0 < iVar2) {
    puVar3 = (uint *)(piVar1 + 3);
    uVar4 = iVar2 + 1;
    iVar2 = 0;
    do {
      iVar5 = 3 - (uint)(*puVar3 < 0x800);
      if ((int)*puVar3 < 0x80) {
        iVar5 = 1;
      }
      iVar2 = iVar2 + iVar5;
      puVar3 = puVar3 + 1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }